

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

rotation_t *
opengv::relative_pose::twopt_rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index0,
          size_t index1)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  rotation_t *prVar16;
  ulong uVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  ActualDstType actualDst;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  MatrixXd Hcross;
  Vector3d f;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  double local_a8;
  rotation_t *local_a0;
  double local_98 [10];
  undefined1 local_48 [16];
  
  local_f8._8_8_ = local_f8._0_8_;
  local_d8._8_8_ = local_d8._0_8_;
  local_a0 = __return_storage_ptr__;
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_118,adapter,index1);
  local_c8 = local_98[0] + (double)local_118.m_data;
  dStack_c0 = local_98[1] + (double)local_118.m_rows;
  local_d8._0_8_ = local_98[2] + (double)local_118.m_cols;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_118,adapter,index1);
  local_e8 = local_98[0] + (double)local_118.m_data;
  dStack_e0 = local_98[1] + (double)local_118.m_rows;
  local_f8._0_8_ = local_98[2] + (double)local_118.m_cols;
  local_118.m_cols = 0;
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,9,3,3);
  if ((local_118.m_rows == 3) && (local_118.m_cols == 3)) {
    uVar21 = 9;
    uVar20 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,9,3,3);
    uVar21 = local_118.m_cols * local_118.m_rows;
    uVar20 = uVar21 + 7;
    if (-1 < (long)uVar21) {
      uVar20 = uVar21;
    }
    uVar20 = uVar20 & 0xfffffffffffffff8;
    pdVar18 = local_118.m_data;
    if ((long)uVar21 < 8) goto LAB_0014bcd4;
  }
  pdVar18 = local_118.m_data;
  uVar17 = 8;
  if (8 < (long)uVar20) {
    uVar17 = uVar20;
  }
  memset(local_118.m_data,0,uVar17 * 8);
LAB_0014bcd4:
  if (uVar21 - uVar20 != 0 && (long)uVar20 <= (long)uVar21) {
    memset(pdVar18 + uVar20,0,(uVar21 - uVar20) * 8);
  }
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,index0);
  local_48._8_8_ = 0x4008000000000000;
  local_48._0_8_ = 0x4008000000000000;
  auVar10._8_8_ = dStack_c0;
  auVar10._0_8_ = local_c8;
  auVar9 = vdivpd_avx(auVar10,local_48);
  local_c8 = (double)local_d8._0_8_ / 3.0;
  auVar12._8_8_ = local_98[1];
  auVar12._0_8_ = local_98[0];
  local_b8 = vsubpd_avx(auVar12,auVar9);
  local_a8 = local_98[2] - local_c8;
  local_d8 = auVar9;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,index0);
  auVar9._8_8_ = dStack_e0;
  auVar9._0_8_ = local_e8;
  pdVar18 = local_98 + 2;
  lVar19 = 0;
  auVar9 = vdivpd_avx(auVar9,local_48);
  local_e8 = (double)local_f8._0_8_ / 3.0;
  auVar13._8_8_ = local_98[1];
  auVar13._0_8_ = local_98[0];
  auVar10 = vsubpd_avx(auVar13,auVar9);
  dVar11 = local_98[2] - local_e8;
  do {
    dVar1 = *(double *)(local_b8 + lVar19 * 8);
    lVar19 = lVar19 + 1;
    pdVar18[-2] = auVar10._0_8_ * dVar1;
    pdVar18[-1] = auVar10._8_8_ * dVar1;
    *pdVar18 = dVar11 * dVar1;
    pdVar18 = pdVar18 + 3;
  } while (lVar19 != 3);
  uVar21 = local_118.m_cols * local_118.m_rows;
  uVar20 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar20 = uVar21;
  }
  if (7 < (long)uVar21) {
    lVar19 = 0;
    do {
      auVar22 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar19),
                               *(undefined1 (*) [64])(local_118.m_data + lVar19));
      *(undefined1 (*) [64])(local_118.m_data + lVar19) = auVar22;
      lVar19 = lVar19 + 8;
    } while (lVar19 < (long)(uVar20 & 0xfffffffffffffff8));
  }
  if ((long)uVar21 % 8 != 0 && (long)(uVar20 & 0xfffffffffffffff8) <= (long)uVar21) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar19 = (long)uVar20 >> 3;
    auVar23 = vpbroadcastq_avx512f();
    uVar20 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar17 = vpcmpuq_avx512f(auVar24,auVar23,2);
      pdVar18 = local_98 + lVar19 * 8 + uVar20;
      bVar2 = (byte)uVar17;
      auVar24._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)pdVar18[1];
      auVar24._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar18;
      auVar24._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)pdVar18[2];
      auVar24._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * (long)pdVar18[3];
      auVar24._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)pdVar18[4];
      auVar24._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * (long)pdVar18[5];
      auVar24._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * (long)pdVar18[6];
      auVar24._56_8_ = (uVar17 >> 7) * (long)pdVar18[7];
      pdVar18 = local_118.m_data + lVar19 * 8 + uVar20;
      auVar25._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)pdVar18[1];
      auVar25._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar18;
      auVar25._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)pdVar18[2];
      auVar25._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * (long)pdVar18[3];
      auVar25._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)pdVar18[4];
      auVar25._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * (long)pdVar18[5];
      auVar25._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * (long)pdVar18[6];
      auVar25._56_8_ = (uVar17 >> 7) * (long)pdVar18[7];
      auVar24 = vaddpd_avx512f(auVar24,auVar25);
      pdVar18 = local_118.m_data + lVar19 * 8 + uVar20;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar17 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar17 >> 6) & 1);
      *pdVar18 = (double)((ulong)(bVar2 & 1) * auVar24._0_8_ |
                         (ulong)!(bool)(bVar2 & 1) * (long)*pdVar18);
      pdVar18[1] = (double)((ulong)bVar3 * auVar24._8_8_ | (ulong)!bVar3 * (long)pdVar18[1]);
      pdVar18[2] = (double)((ulong)bVar4 * auVar24._16_8_ | (ulong)!bVar4 * (long)pdVar18[2]);
      pdVar18[3] = (double)((ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * (long)pdVar18[3]);
      pdVar18[4] = (double)((ulong)bVar6 * auVar24._32_8_ | (ulong)!bVar6 * (long)pdVar18[4]);
      pdVar18[5] = (double)((ulong)bVar7 * auVar24._40_8_ | (ulong)!bVar7 * (long)pdVar18[5]);
      pdVar18[6] = (double)((ulong)bVar8 * auVar24._48_8_ | (ulong)!bVar8 * (long)pdVar18[6]);
      pdVar18[7] = (double)((uVar17 >> 7) * auVar24._56_8_ |
                           (ulong)!SUB81(uVar17 >> 7,0) * (long)pdVar18[7]);
      uVar20 = uVar20 + 8;
    } while (((long)uVar21 % 8 + 7U & 0xfffffffffffffff8) != uVar20);
  }
  local_f8 = auVar9;
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,index1);
  auVar14._8_8_ = local_98[1];
  auVar14._0_8_ = local_98[0];
  local_b8 = vsubpd_avx(auVar14,local_d8);
  local_a8 = local_98[2] - local_c8;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,index1);
  prVar16 = local_a0;
  pdVar18 = local_98 + 2;
  lVar19 = 0;
  auVar15._8_8_ = local_98[1];
  auVar15._0_8_ = local_98[0];
  auVar9 = vsubpd_avx(auVar15,local_f8);
  do {
    dVar11 = *(double *)(local_b8 + lVar19 * 8);
    lVar19 = lVar19 + 1;
    pdVar18[-2] = auVar9._0_8_ * dVar11;
    pdVar18[-1] = auVar9._8_8_ * dVar11;
    *pdVar18 = (local_98[2] - local_e8) * dVar11;
    pdVar18 = pdVar18 + 3;
  } while (lVar19 != 3);
  uVar21 = local_118.m_cols * local_118.m_rows;
  uVar20 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar20 = uVar21;
  }
  if (7 < (long)uVar21) {
    lVar19 = 0;
    do {
      auVar22 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar19),
                               *(undefined1 (*) [64])(local_118.m_data + lVar19));
      *(undefined1 (*) [64])(local_118.m_data + lVar19) = auVar22;
      lVar19 = lVar19 + 8;
    } while (lVar19 < (long)(uVar20 & 0xfffffffffffffff8));
  }
  if ((long)uVar21 % 8 != 0 && (long)(uVar20 & 0xfffffffffffffff8) <= (long)uVar21) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar19 = (long)uVar20 >> 3;
    auVar23 = vpbroadcastq_avx512f();
    uVar20 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar17 = vpcmpuq_avx512f(auVar24,auVar23,2);
      pdVar18 = local_98 + lVar19 * 8 + uVar20;
      bVar2 = (byte)uVar17;
      auVar26._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)pdVar18[1];
      auVar26._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar18;
      auVar26._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)pdVar18[2];
      auVar26._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * (long)pdVar18[3];
      auVar26._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)pdVar18[4];
      auVar26._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * (long)pdVar18[5];
      auVar26._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * (long)pdVar18[6];
      auVar26._56_8_ = (uVar17 >> 7) * (long)pdVar18[7];
      pdVar18 = local_118.m_data + lVar19 * 8 + uVar20;
      auVar27._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)pdVar18[1];
      auVar27._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar18;
      auVar27._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)pdVar18[2];
      auVar27._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * (long)pdVar18[3];
      auVar27._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)pdVar18[4];
      auVar27._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * (long)pdVar18[5];
      auVar27._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * (long)pdVar18[6];
      auVar27._56_8_ = (uVar17 >> 7) * (long)pdVar18[7];
      auVar24 = vaddpd_avx512f(auVar26,auVar27);
      pdVar18 = local_118.m_data + lVar19 * 8 + uVar20;
      bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar17 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar17 >> 6) & 1);
      *pdVar18 = (double)((ulong)(bVar2 & 1) * auVar24._0_8_ |
                         (ulong)!(bool)(bVar2 & 1) * (long)*pdVar18);
      pdVar18[1] = (double)((ulong)bVar3 * auVar24._8_8_ | (ulong)!bVar3 * (long)pdVar18[1]);
      pdVar18[2] = (double)((ulong)bVar4 * auVar24._16_8_ | (ulong)!bVar4 * (long)pdVar18[2]);
      pdVar18[3] = (double)((ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * (long)pdVar18[3]);
      pdVar18[4] = (double)((ulong)bVar6 * auVar24._32_8_ | (ulong)!bVar6 * (long)pdVar18[4]);
      pdVar18[5] = (double)((ulong)bVar7 * auVar24._40_8_ | (ulong)!bVar7 * (long)pdVar18[5]);
      pdVar18[6] = (double)((ulong)bVar8 * auVar24._48_8_ | (ulong)!bVar8 * (long)pdVar18[6]);
      pdVar18[7] = (double)((uVar17 >> 7) * auVar24._56_8_ |
                           (ulong)!SUB81(uVar17 >> 7,0) * (long)pdVar18[7]);
      uVar20 = uVar20 + 8;
    } while (((long)uVar21 % 8 + 7U & 0xfffffffffffffff8) != uVar20);
  }
  math::arun(local_a0,(MatrixXd *)&local_118);
  if (local_118.m_data != (double *)0x0) {
    free((void *)local_118.m_data[-1]);
  }
  return prVar16;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d pointsCenter1 =
      adapter.getBearingVector1(index0) + adapter.getBearingVector1(index1);
  Eigen::Vector3d pointsCenter2 =
      adapter.getBearingVector2(index0) + adapter.getBearingVector2(index1);
  pointsCenter1 = pointsCenter1/3.0;
  pointsCenter2 = pointsCenter2/3.0;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  Eigen::Vector3d f = adapter.getBearingVector1(index0) - pointsCenter1;
  Eigen::Vector3d fprime = adapter.getBearingVector2(index0) - pointsCenter2;
  Hcross += fprime * f.transpose();
  f = adapter.getBearingVector1(index1) - pointsCenter1;
  fprime = adapter.getBearingVector2(index1) - pointsCenter2;
  Hcross += fprime * f.transpose();

  return math::arun(Hcross);
}